

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

Error llvm::createStringError<unsigned_long,unsigned_short>
                (error_code EC,char *Fmt,unsigned_long *Vals,unsigned_short *Vals_1)

{
  undefined2 *in_R9;
  format_object_base local_98;
  undefined2 local_88;
  undefined8 local_80;
  undefined1 local_78 [8];
  raw_string_ostream Stream;
  error_code EC_local;
  string Buffer;
  
  Stream.OS._0_4_ = EC._M_cat._0_4_;
  Buffer._M_dataplus._M_p = (pointer)0x0;
  Buffer._M_string_length._0_1_ = 0;
  Stream.super_raw_ostream.OutBufCur._0_4_ = 1;
  Stream.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
  Stream.super_raw_ostream.OutBufStart = (char *)0x0;
  Stream.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_78 = (undefined1  [8])&PTR__raw_string_ostream_010994b8;
  Stream.super_raw_ostream._32_8_ = &EC_local._M_cat;
  local_98._vptr_format_object_base = (_func_int **)&PTR_home_010985c8;
  local_88 = *in_R9;
  local_80 = *(undefined8 *)Vals_1;
  local_98.Fmt = (char *)Vals;
  EC_local._0_8_ = Fmt;
  EC_local._M_cat = (error_category *)&Buffer._M_string_length;
  raw_ostream::operator<<((raw_ostream *)local_78,&local_98);
  if ((_func_int **)Stream.super_raw_ostream.OutBufEnd != Stream.super_raw_ostream._vptr_raw_ostream
     ) {
    raw_ostream::flush_nonempty((raw_ostream *)local_78);
  }
  make_error<llvm::StringError,std::__cxx11::string&,std::error_code&>
            (EC._0_8_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Stream.super_raw_ostream._32_8_,(error_code *)&Stream.OS);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_78);
  if (EC_local._M_cat != (error_category *)&Buffer._M_string_length) {
    operator_delete(EC_local._M_cat,
                    CONCAT71(Buffer._M_string_length._1_7_,(undefined1)Buffer._M_string_length) + 1)
    ;
  }
  return (Error)(ErrorInfoBase *)EC._0_8_;
}

Assistant:

inline Error createStringError(std::error_code EC, char const *Fmt,
                               const Ts &... Vals) {
  std::string Buffer;
  raw_string_ostream Stream(Buffer);
  Stream << format(Fmt, Vals...);
  return make_error<StringError>(Stream.str(), EC);
}